

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O3

Curve * Assimp::IFC::Curve::Convert(IfcCurve *curve,ConversionData *conv)

{
  undefined8 *puVar1;
  iterator __position;
  DataType *pDVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  char cVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  IfcCurve *pIVar10;
  Curve *pCVar11;
  IfcCartesianPoint *pIVar12;
  Curve *__p;
  IfcCompositeCurveSegment *pIVar13;
  IfcConic *entity;
  Conic *this_00;
  undefined **ppuVar14;
  IfcVector *in;
  string *psVar15;
  bool bVar16;
  _func_int *p_Var17;
  undefined8 *puVar18;
  double dVar19;
  double in_XMM1_Qa;
  double dVar20;
  IfcVector3 point;
  shared_ptr<Assimp::IFC::Curve> cv;
  undefined1 local_a8 [8];
  _Alloc_hider _Stack_a0;
  _func_int *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
  *local_78;
  element_type *local_70;
  undefined1 local_68 [16];
  double local_58;
  Curve *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  long local_38;
  
  p_Var17 = (_func_int *)
            ((long)&(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]);
  lVar9 = __dynamic_cast(p_Var17,&STEP::Object::typeinfo,&IFC::Schema_2x3::IfcBoundedCurve::typeinfo
                         ,0xffffffffffffffff);
  if (lVar9 != 0) {
    pIVar10 = (IfcCurve *)
              __dynamic_cast(p_Var17,&STEP::Object::typeinfo,&IFC::Schema_2x3::IfcPolyline::typeinfo
                             ,0xffffffffffffffff);
    if (pIVar10 != (IfcCurve *)0x0) {
      pCVar11 = (Curve *)operator_new(0x30);
      pCVar11->base_entity = pIVar10;
      pCVar11->conv = conv;
      pCVar11->_vptr_Curve = (_func_int **)&PTR__PolyLine_008cdea8;
      pCVar11[1]._vptr_Curve = 0;
      *(undefined8 *)((long)(pCVar11 + 1) + 8) = 0;
      *(undefined8 *)((long)(pCVar11 + 1) + 0x10) = 0;
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)(pCVar11 + 1),
                 *(long *)&pIVar10[1].super_IfcGeometricRepresentationItem.
                           super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           field_0x10 -
                 *(long *)&pIVar10[1].super_IfcGeometricRepresentationItem.
                           super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           field_0x8 >> 3);
      local_a8 = (undefined1  [8])0x0;
      _Stack_a0._M_p = (pointer)0x0;
      local_98 = (_func_int *)0x0;
      puVar18 = *(undefined8 **)
                 &pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x8;
      puVar1 = *(undefined8 **)
                &pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10;
      if (puVar18 == puVar1) {
        return pCVar11;
      }
      do {
        pIVar12 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                            ((LazyObject *)*puVar18);
        ConvertCartesianPoint((IfcVector3 *)local_a8,pIVar12);
        __position._M_current = *(aiVector3t<double> **)((long)(pCVar11 + 1) + 8);
        if (__position._M_current == *(aiVector3t<double> **)((long)(pCVar11 + 1) + 0x10)) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>const&>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)(pCVar11 + 1),
                     __position,(IfcVector3 *)local_a8);
        }
        else {
          (__position._M_current)->z = (double)local_98;
          (__position._M_current)->x = (double)local_a8;
          (__position._M_current)->y = (double)_Stack_a0._M_p;
          *(long *)((long)(pCVar11 + 1) + 8U) = *(long *)((long)(pCVar11 + 1) + 8U) + 0x18;
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar1);
      return pCVar11;
    }
    local_78 = (vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
                *)__dynamic_cast(p_Var17,&STEP::Object::typeinfo,
                                 &IFC::Schema_2x3::IfcTrimmedCurve::typeinfo,0xffffffffffffffff);
    if (local_78 !=
        (vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
         *)0x0) {
      pCVar11 = (Curve *)operator_new(0x48);
      pCVar11->base_entity = (IfcCurve *)local_78;
      pCVar11->conv = conv;
      pCVar11->_vptr_Curve = (_func_int **)&PTR__TrimmedCurve_008cdf10;
      pCVar11[1]._vptr_Curve = 0;
      *(undefined8 *)((long)(pCVar11 + 1) + 8) = 0;
      pIVar10 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCurve>
                          (*(LazyObject **)
                            &(((IfcCurve *)((long)local_78 + 0x48))->
                             super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                             .field_0x8);
      __p = Convert(pIVar10,conv);
      *(Curve **)((long)(pCVar11 + 2) + 8) = __p;
      local_38 = (long)(pCVar11 + 2) + 0x10;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::Curve*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_38,__p);
      local_68._0_8_ = (element_type *)0x0;
      local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58 = 0.0;
      puVar18 = *(undefined8 **)
                 &(((IfcCurve *)((long)local_78 + 0x48))->super_IfcGeometricRepresentationItem).
                  super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10
      ;
      puVar1 = *(undefined8 **)
                &(((IfcCurve *)((long)local_78 + 0x48))->super_IfcGeometricRepresentationItem).
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18;
      if (puVar18 == puVar1) {
LAB_005ba977:
        psVar15 = (string *)__cxa_allocate_exception(0x20);
        local_a8 = (undefined1  [8])&local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,
                   "IfcTrimmedCurve: failed to read first trim parameter, ignoring curve","");
        *(string **)psVar15 = psVar15 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar15,local_a8,_Stack_a0._M_p + (long)local_a8);
        __cxa_throw(psVar15,&CurveError::typeinfo,CurveError::~CurveError);
      }
      local_70 = (element_type *)(pCVar11 + 1);
      bVar7 = false;
      bVar16 = false;
      do {
        pDVar2 = (DataType *)*puVar18;
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar18[1];
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        lVar9 = __dynamic_cast(pDVar2,&STEP::EXPRESS::DataType::typeinfo,
                               &STEP::EXPRESS::PrimitiveDataType<double>::typeinfo,0);
        if (lVar9 == 0) {
          pIVar12 = STEP::EXPRESS::DataType::
                    ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcCartesianPoint>(pDVar2,conv->db);
          if (pIVar12 != (IfcCartesianPoint *)0x0) {
            bVar16 = true;
            ConvertCartesianPoint((IfcVector3 *)local_68,pIVar12);
          }
        }
        else {
          (local_70->super_Curve)._vptr_Curve = (_func_int **)*(undefined8 *)(lVar9 + 8);
          bVar7 = true;
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
      } while ((lVar9 == 0) && (puVar18 = puVar18 + 2, puVar18 != puVar1));
      if ((!bVar7) &&
         ((!bVar16 ||
          (cVar6 = (**(code **)(**(long **)((long)(pCVar11 + 2) + 8) + 0x20))
                             (*(long **)((long)(pCVar11 + 2) + 8),local_68,local_70), cVar6 == '\0')
          ))) goto LAB_005ba977;
      puVar18 = *(undefined8 **)
                 &(((IfcCurve *)((long)local_78 + 0x48))->super_IfcGeometricRepresentationItem).
                  field_0x28;
      puVar1 = *(undefined8 **)
                &(((IfcCurve *)((long)local_78 + 0x48))->super_IfcGeometricRepresentationItem).
                 field_0x30;
      if (puVar18 == puVar1) {
LAB_005ba9e1:
        psVar15 = (string *)__cxa_allocate_exception(0x20);
        local_a8 = (undefined1  [8])&local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,
                   "IfcTrimmedCurve: failed to read second trim parameter, ignoring curve","");
        *(string **)psVar15 = psVar15 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar15,local_a8,_Stack_a0._M_p + (long)local_a8);
        __cxa_throw(psVar15,&CurveError::typeinfo,CurveError::~CurveError);
      }
      bVar7 = false;
      bVar16 = false;
      do {
        pDVar2 = (DataType *)*puVar18;
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar18[1];
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        lVar9 = __dynamic_cast(pDVar2,&STEP::EXPRESS::DataType::typeinfo,
                               &STEP::EXPRESS::PrimitiveDataType<double>::typeinfo,0);
        if (lVar9 == 0) {
          pIVar12 = STEP::EXPRESS::DataType::
                    ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcCartesianPoint>(pDVar2,conv->db);
          if (pIVar12 != (IfcCartesianPoint *)0x0) {
            bVar16 = true;
            ConvertCartesianPoint((IfcVector3 *)local_68,pIVar12);
          }
        }
        else {
          *(undefined8 *)((long)(pCVar11 + 1) + 8) = *(undefined8 *)(lVar9 + 8);
          bVar7 = true;
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
      } while ((lVar9 == 0) && (puVar18 = puVar18 + 2, puVar18 != puVar1));
      if ((!bVar7) &&
         ((!bVar16 ||
          (cVar6 = (**(code **)(**(long **)((long)(pCVar11 + 2) + 8) + 0x20))
                             (*(long **)((long)(pCVar11 + 2) + 8),local_68,(long)(pCVar11 + 1) + 8),
          cVar6 == '\0')))) goto LAB_005ba9e1;
      local_a8 = (undefined1  [8])&PTR__PrimitiveDataType_008ce208;
      _Stack_a0._M_p = (pointer)&local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_a0,*(long *)&((IfcCurve *)((long)local_78 + 0x48))->field_0x40,
                 (long)(((IfcCurve *)((long)local_78 + 0x90))->super_IfcGeometricRepresentationItem)
                       .super_IfcRepresentationItem.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                       _vptr_ObjectHelper +
                 *(long *)&((IfcCurve *)((long)local_78 + 0x48))->field_0x40);
      local_a8 = (undefined1  [8])&PTR__PrimitiveDataType_008ce1d0;
      bVar7 = IsTrue((BOOLEAN *)local_a8);
      *(bool *)(pCVar11 + 2) = bVar7;
      local_a8 = (undefined1  [8])&PTR__PrimitiveDataType_008ce208;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_a0._M_p == &local_90) {
        if (bVar7) goto LAB_005ba432;
      }
      else {
        operator_delete(_Stack_a0._M_p,local_90._M_allocated_capacity + 1);
        if ((*(byte *)(pCVar11 + 2) & 1) != 0) goto LAB_005ba432;
      }
      pIVar10 = (IfcCurve *)(local_70->super_Curve)._vptr_Curve;
      (local_70->super_Curve)._vptr_Curve =
           (_func_int **)*(IfcCurve **)((long)&local_70->super_Curve + 8);
      *(IfcCurve **)((long)&local_70->super_Curve + 8) = pIVar10;
LAB_005ba432:
      cVar6 = (**(code **)(**(long **)((long)(pCVar11 + 2) + 8) + 0x10))();
      if (cVar6 == '\0') {
        dVar20 = *(double *)((long)(pCVar11 + 1) + 8);
      }
      else {
        dVar20 = *(double *)((long)(pCVar11 + 1) + 8);
        if (dVar20 < *(double *)(pCVar11 + 1)) {
          dVar19 = (double)(**(code **)(**(long **)((long)(pCVar11 + 2) + 8) + 0x28))();
          dVar20 = ABS(dVar20 - dVar19) + *(double *)((long)(pCVar11 + 1) + 8);
          *(double *)((long)(pCVar11 + 1) + 8) = dVar20;
        }
      }
      dVar19 = *(double *)(pCVar11 + 1);
      *(double *)((long)(pCVar11 + 1) + 0x10) = dVar20 - dVar19;
      if (0.0 <= dVar20 - dVar19) {
        return pCVar11;
      }
      __assert_fail("maxval >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCCurve.cpp"
                    ,0x176,
                    "Assimp::IFC::(anonymous namespace)::TrimmedCurve::TrimmedCurve(const Schema_2x3::IfcTrimmedCurve &, ConversionData &)"
                   );
    }
    pIVar10 = (IfcCurve *)
              __dynamic_cast(p_Var17,&STEP::Object::typeinfo,
                             &IFC::Schema_2x3::IfcCompositeCurve::typeinfo,0xffffffffffffffff);
    if (pIVar10 != (IfcCurve *)0x0) {
      pCVar11 = (Curve *)operator_new(0x38);
      pCVar11->base_entity = pIVar10;
      pCVar11->conv = conv;
      pCVar11->_vptr_Curve = (_func_int **)&PTR__CompositeCurve_008cdf78;
      local_78 = (vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
                  *)(pCVar11 + 1);
      pCVar11[1]._vptr_Curve = 0;
      *(undefined8 *)((long)(pCVar11 + 1) + 8) = 0;
      *(undefined8 *)((long)(pCVar11 + 1) + 0x10) = 0;
      pCVar11[2]._vptr_Curve = 0;
      std::
      vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
      ::reserve((vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
                 *)local_78,
                *(long *)&pIVar10[1].super_IfcGeometricRepresentationItem.
                          super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          field_0x10 -
                *(long *)&pIVar10[1].super_IfcGeometricRepresentationItem.
                          super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          field_0x8 >> 3);
      puVar18 = *(undefined8 **)
                 &pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x8;
      puVar1 = *(undefined8 **)
                &pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10;
      if (puVar18 != puVar1) {
        do {
          pIVar13 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCompositeCurveSegment>
                              ((LazyObject *)*puVar18);
          pIVar10 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCurve>
                              ((pIVar13->ParentCurve).obj);
          local_48 = Convert(pIVar10,conv);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::Curve*>
                    (&local_40,local_48);
          if ((local_48 == (Curve *)0x0) ||
             (local_70 = (element_type *)
                         __dynamic_cast(local_48,&typeinfo,&BoundedCurve::typeinfo,0),
             this._M_pi = local_40._M_pi, local_70 == (element_type *)0x0)) {
            LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5ba5b9);
          }
          else {
            if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
              }
            }
            lVar9 = *(long *)&(pIVar13->super_IfcGeometricRepresentationItem).field_0x30;
            local_a8 = (undefined1  [8])&local_98;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_a8,lVar9,*(long *)&pIVar13->field_0x38 + lVar9);
            iVar8 = std::__cxx11::string::compare((char *)local_a8);
            if (local_a8 != (undefined1  [8])&local_98) {
              operator_delete((void *)local_a8,(ulong)(local_98 + 1));
            }
            if (iVar8 != 0) {
              LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5ba628);
            }
            local_a8 = (undefined1  [8])&PTR__PrimitiveDataType_008ce208;
            _Stack_a0._M_p = (pointer)&local_90;
            pcVar4 = (pIVar13->SameSense)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&_Stack_a0,pcVar4,pcVar4 + (pIVar13->SameSense)._M_string_length);
            local_a8 = (undefined1  [8])&PTR__PrimitiveDataType_008ce1d0;
            bVar7 = IsTrue((BOOLEAN *)local_a8);
            peVar5 = local_70;
            local_68._0_8_ = local_70;
            local_68._8_8_ = this._M_pi;
            if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
              }
            }
            local_58 = (double)CONCAT71(local_58._1_7_,bVar7);
            std::
            vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
            ::emplace_back<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>
                      (local_78,(pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool> *)local_68);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
            }
            local_a8 = (undefined1  [8])&PTR__PrimitiveDataType_008ce208;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Stack_a0._M_p != &local_90) {
              operator_delete(_Stack_a0._M_p,local_90._M_allocated_capacity + 1);
            }
            dVar20 = (double)(**(code **)((long)(peVar5->super_Curve)._vptr_Curve + 0x28))(peVar5);
            in_XMM1_Qa = ABS(in_XMM1_Qa - dVar20) + *(double *)(pCVar11 + 2);
            *(double *)(pCVar11 + 2) = in_XMM1_Qa;
            if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
            }
          }
          if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
          }
          puVar18 = puVar18 + 1;
        } while (puVar18 != puVar1);
      }
      if (*(long *)(pCVar11 + 1) != *(long *)((long)(pCVar11 + 1) + 8)) {
        return pCVar11;
      }
      psVar15 = (string *)__cxa_allocate_exception(0x20);
      local_a8 = (undefined1  [8])&local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"empty composite curve","")
      ;
      *(string **)psVar15 = psVar15 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar15,local_a8,_Stack_a0._M_p + (long)local_a8);
      __cxa_throw(psVar15,&CurveError::typeinfo,CurveError::~CurveError);
    }
  }
  lVar9 = __dynamic_cast(p_Var17,&STEP::Object::typeinfo,&IFC::Schema_2x3::IfcConic::typeinfo,
                         0xffffffffffffffff);
  if (lVar9 == 0) {
LAB_005ba884:
    pIVar10 = (IfcCurve *)
              __dynamic_cast(p_Var17,&STEP::Object::typeinfo,&IFC::Schema_2x3::IfcLine::typeinfo,
                             0xffffffffffffffff);
    if (pIVar10 == (IfcCurve *)0x0) {
      this_00 = (Conic *)0x0;
    }
    else {
      this_00 = (Conic *)operator_new(0x48);
      (this_00->super_Curve).base_entity = pIVar10;
      (this_00->super_Curve).conv = conv;
      (this_00->super_Curve)._vptr_Curve = (_func_int **)&PTR__Curve_008ce118;
      (this_00->location).x = 0.0;
      (this_00->location).y = 0.0;
      (this_00->location).z = 0.0;
      this_00->p[0].x = 0.0;
      this_00->p[0].y = 0.0;
      this_00->p[0].z = 0.0;
      pIVar12 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                          (*(LazyObject **)&pIVar10->field_0x40);
      ConvertCartesianPoint(&this_00->location,pIVar12);
      in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcVector>
                     ((LazyObject *)
                      pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      _vptr_ObjectHelper);
      ConvertVector(this_00->p,in);
    }
  }
  else {
    entity = (IfcConic *)
             __dynamic_cast(p_Var17,&STEP::Object::typeinfo,&IFC::Schema_2x3::IfcCircle::typeinfo,
                            0xffffffffffffffff);
    if (entity == (IfcConic *)0x0) {
      entity = (IfcConic *)
               __dynamic_cast(p_Var17,&STEP::Object::typeinfo,&IFC::Schema_2x3::IfcEllipse::typeinfo
                              ,0xffffffffffffffff);
      if (entity == (IfcConic *)0x0) goto LAB_005ba884;
      this_00 = (Conic *)operator_new(0x80);
      anon_unknown_9::Conic::Conic(this_00,entity,conv);
      ppuVar14 = &PTR__Curve_008ce0b0;
    }
    else {
      this_00 = (Conic *)operator_new(0x80);
      anon_unknown_9::Conic::Conic(this_00,entity,conv);
      ppuVar14 = &PTR__Curve_008cdfe0;
    }
    (this_00->super_Curve)._vptr_Curve = (_func_int **)ppuVar14;
    this_00[1].super_Curve._vptr_Curve = (_func_int **)entity;
  }
  return &this_00->super_Curve;
}

Assistant:

Curve* Curve::Convert(const IFC::Schema_2x3::IfcCurve& curve,ConversionData& conv) {
    if(curve.ToPtr<Schema_2x3::IfcBoundedCurve>()) {
        if(const Schema_2x3::IfcPolyline* c = curve.ToPtr<Schema_2x3::IfcPolyline>()) {
            return new PolyLine(*c,conv);
        }
        if(const Schema_2x3::IfcTrimmedCurve* c = curve.ToPtr<Schema_2x3::IfcTrimmedCurve>()) {
            return new TrimmedCurve(*c,conv);
        }
        if(const Schema_2x3::IfcCompositeCurve* c = curve.ToPtr<Schema_2x3::IfcCompositeCurve>()) {
            return new CompositeCurve(*c,conv);
        }
    }

    if(curve.ToPtr<Schema_2x3::IfcConic>()) {
        if(const Schema_2x3::IfcCircle* c = curve.ToPtr<Schema_2x3::IfcCircle>()) {
            return new Circle(*c,conv);
        }
        if(const Schema_2x3::IfcEllipse* c = curve.ToPtr<Schema_2x3::IfcEllipse>()) {
            return new Ellipse(*c,conv);
        }
    }

    if(const Schema_2x3::IfcLine* c = curve.ToPtr<Schema_2x3::IfcLine>()) {
        return new Line(*c,conv);
    }

    // XXX OffsetCurve2D, OffsetCurve3D not currently supported
    return NULL;
}